

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

string * __thiscall rcg::Stream::getTLType_abi_cxx11_(string *__return_storage_ptr__,Stream *this)

{
  GC_ERROR GVar1;
  INFO_DATATYPE type;
  size_t size;
  char tmp [1024];
  
  std::recursive_mutex::lock(&this->mtx);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memset(tmp,0,0x400);
  size = 0x400;
  if (this->stream != (DS_HANDLE)0x0) {
    GVar1 = (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->DSGetInfo)(this->stream,10,&type,tmp,&size);
    if ((GVar1 == 0) && (type == 1)) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return __return_storage_ptr__;
}

Assistant:

std::string Stream::getTLType()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t size=sizeof(tmp);

  if (stream != 0)
  {
    if (gentl->DSGetInfo(stream, GenTL::STREAM_INFO_TLTYPE, &type, tmp, &size) ==
        GenTL::GC_ERR_SUCCESS)
    {
      if (type == GenTL::INFO_DATATYPE_STRING)
      {
        ret=tmp;
      }
    }
  }

  return ret;
}